

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly345.cpp
# Opt level: O3

double __thiscall chrono::ChFunction_Poly345::Get_y(ChFunction_Poly345 *this,double x)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double __x;
  undefined1 extraout_var [56];
  
  dVar5 = 0.0;
  if (0.0 < x) {
    if (this->end <= x) {
      dVar5 = this->h;
    }
    else {
      __x = x / this->end;
      dVar5 = this->h;
      dVar1 = pow(__x,3.0);
      dVar2 = pow(__x,4.0);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dVar2 * -15.0;
      auVar3 = vfmadd231sd_fma(auVar3,auVar6,ZEXT816(0x4024000000000000));
      auVar4._0_8_ = pow(__x,5.0);
      auVar4._8_56_ = extraout_var;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = auVar3._0_8_;
      auVar3 = vfmadd132sd_fma(auVar4._0_16_,auVar7,ZEXT816(0x4018000000000000));
      dVar5 = auVar3._0_8_ * dVar5;
    }
  }
  return dVar5;
}

Assistant:

double ChFunction_Poly345::Get_y(double x) const {
    double ret = 0;
    if (x <= 0)
        return 0;
    if (x >= end)
        return h;
    double a = x / end;
    ret = h * (10 * pow(a, 3) - 15 * pow(a, 4) + 6 * pow(a, 5));
    return ret;
}